

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O1

void __thiscall duckdb::ArrayColumnData::RevertAppend(ArrayColumnData *this,row_t start_row)

{
  idx_t iVar1;
  pointer pCVar2;
  
  ColumnData::RevertAppend(&(this->validity).super_ColumnData,start_row);
  iVar1 = ArrayType::GetSize(&(this->super_ColumnData).type);
  pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  (*pCVar2->_vptr_ColumnData[0x14])(pCVar2,iVar1 * start_row);
  LOCK();
  (this->super_ColumnData).count.super___atomic_base<unsigned_long>._M_i =
       start_row - (this->super_ColumnData).start;
  UNLOCK();
  return;
}

Assistant:

void ArrayColumnData::RevertAppend(row_t start_row) {
	// Revert validity
	validity.RevertAppend(start_row);
	// Revert child column
	auto array_size = ArrayType::GetSize(type);
	child_column->RevertAppend(start_row * UnsafeNumericCast<row_t>(array_size));

	this->count = UnsafeNumericCast<idx_t>(start_row) - this->start;
}